

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar2 = p + 2;
    }
    do {
      if (*pcVar2 == '\0') {
        lj_err_caller(ms->L,LJ_ERR_STRPATM);
      }
      pcVar1 = pcVar2 + 1;
      if ((*pcVar2 == '%') && (pcVar2[1] != '\0')) {
        pcVar1 = pcVar2 + 2;
      }
      pcVar2 = pcVar1;
    } while (*pcVar2 != ']');
    pcVar2 = pcVar2 + 1;
  }
  else if (*p == '%') {
    if (*pcVar2 == '\0') {
      lj_err_caller(ms->L,LJ_ERR_STRPATE);
    }
    pcVar2 = p + 2;
  }
  return pcVar2;
}

Assistant:

static const char *classend(MatchState *ms, const char *p)
{
  switch (*p++) {
  case L_ESC:
    if (*p == '\0')
      lj_err_caller(ms->L, LJ_ERR_STRPATE);
    return p+1;
  case '[':
    if (*p == '^') p++;
    do {  /* look for a `]' */
      if (*p == '\0')
	lj_err_caller(ms->L, LJ_ERR_STRPATM);
      if (*(p++) == L_ESC && *p != '\0')
	p++;  /* skip escapes (e.g. `%]') */
    } while (*p != ']');
    return p+1;
  default:
    return p;
  }
}